

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_11362::SolverDpllTriadSimd<2>::BranchOnBandAndValue<1>
          (SolverDpllTriadSimd<2> *this,int band_idx,Cells08 *value_mask,State *state)

{
  bool bVar1;
  long in_RDI;
  Cells08 negation_elims;
  Cells08 assignment_elims;
  State state_copy;
  Cells08 value_configurations;
  Band *band;
  Bitvec08x16 *in_stack_fffffffffffffd80;
  Bitvec08x16 *in_stack_fffffffffffffd88;
  State *in_stack_fffffffffffffd90;
  SolverDpllTriadSimd<2> *in_stack_fffffffffffffd98;
  State *in_stack_fffffffffffffdb0;
  State *in_stack_fffffffffffffdb8;
  
  Bitvec08x16::operator&(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  *(long *)(in_RDI + 0x1f0) = *(long *)(in_RDI + 0x1f0) + 1;
  State::State(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Bitvec08x16::ClearLowBit((Bitvec08x16 *)in_stack_fffffffffffffd98);
  Bitvec08x16::operator|=(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  bVar1 = BandEliminate<1>((State *)state_copy.bands[0][0].eliminations.vec[1],
                           state_copy.bands[0][0].eliminations.vec[0]._4_4_,
                           (int)state_copy.bands[0][0].eliminations.vec[0]);
  if ((!bVar1) ||
     (CountSolutionsConsistentWithPartialAssignment
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90),
     *(long *)(in_RDI + 0x1e8) != *(long *)(in_RDI + 0x1e0))) {
    Bitvec08x16::operator^(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    Bitvec08x16::operator|=(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    bVar1 = BandEliminate<1>((State *)state_copy.bands[0][0].eliminations.vec[1],
                             state_copy.bands[0][0].eliminations.vec[0]._4_4_,
                             (int)state_copy.bands[0][0].eliminations.vec[0]);
    if (bVar1) {
      CountSolutionsConsistentWithPartialAssignment
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    }
  }
  return;
}

Assistant:

void BranchOnBandAndValue(int band_idx, const Cells08 &value_mask, State &state) {
        Band &band = state.bands[vertical][band_idx];
        // we enter with two or more possible configurations for this value
        Cells08 value_configurations = band.configurations & value_mask;
        // assign the first configuration by eliminating the others
        num_guesses_++;
        State state_copy = state;
        Cells08 assignment_elims = value_configurations.ClearLowBit();
        state_copy.bands[vertical][band_idx].eliminations |= assignment_elims;
        if (BandEliminate<vertical>(state_copy, band_idx)) {
            CountSolutionsConsistentWithPartialAssignment(state_copy);
            if (num_solutions_ == limit_) return;
        }
        // now negate the first configuration
        Cells08 negation_elims = value_configurations ^ assignment_elims;
        state.bands[vertical][band_idx].eliminations |= negation_elims;
        if (BandEliminate<vertical>(state, band_idx)) {
            CountSolutionsConsistentWithPartialAssignment(state);
        }
    }